

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsBase.hpp
# Opt level: O2

void __thiscall
vkt::sparse::SparseShaderIntrinsicsInstanceBase::SparseShaderIntrinsicsInstanceBase
          (SparseShaderIntrinsicsInstanceBase *this,Context *context,SpirVFunction function,
          ImageType imageType,UVec3 *imageSize,TextureFormat *format)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_SparseResourcesBaseInstance).super_TestInstance.m_context = context;
  (this->super_SparseResourcesBaseInstance).m_queues._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  p_Var1 = &(this->super_SparseResourcesBaseInstance).m_queues._M_t._M_impl.super__Rb_tree_header;
  (this->super_SparseResourcesBaseInstance).m_queues._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_SparseResourcesBaseInstance).m_queues._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (this->super_SparseResourcesBaseInstance).m_queues._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->super_SparseResourcesBaseInstance).m_queues._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (this->super_SparseResourcesBaseInstance).m_deviceDriver.
  super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr =
       (DeviceDriver *)0x0;
  (this->super_SparseResourcesBaseInstance).m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.
  object = (VkDevice_s *)0x0;
  (this->super_SparseResourcesBaseInstance).m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.
  deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  (this->super_SparseResourcesBaseInstance).m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.
  deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  (this->super_SparseResourcesBaseInstance).m_allocator.
  super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr = (Allocator *)0x0;
  (this->super_SparseResourcesBaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__SparseShaderIntrinsicsInstanceBase_00c08440;
  this->m_function = function;
  this->m_imageType = imageType;
  tcu::Vector<unsigned_int,_3>::Vector(&this->m_imageSize,imageSize);
  this->m_format = *format;
  (this->m_residencyFormat).order = R;
  (this->m_residencyFormat).type = UNSIGNED_INT32;
  memset(&this->pipelines,0,0x98);
  return;
}

Assistant:

SparseShaderIntrinsicsInstanceBase		(Context&					context,
											 const SpirVFunction		function,
											 const ImageType			imageType,
											 const tcu::UVec3&			imageSize,
											 const tcu::TextureFormat&	format)
		: SparseResourcesBaseInstance(context)
		, m_function(function)
		, m_imageType(imageType)
		, m_imageSize(imageSize)
		, m_format(format)
		, m_residencyFormat(tcu::TextureFormat::R, tcu::TextureFormat::UNSIGNED_INT32)
	{
	}